

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

void __thiscall re2::DFA::ClearCache(DFA *this)

{
  _Hash_node_base *p_Var1;
  ulong uVar2;
  vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> v;
  vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> local_38;
  
  local_38.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (State **)0x0;
  local_38.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (State **)0x0;
  local_38.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (State **)0x0;
  std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::reserve
            (&local_38,(this->state_cache_)._M_h._M_element_count);
  for (p_Var1 = (this->state_cache_)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    if (local_38.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_38.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<re2::DFA::State*,std::allocator<re2::DFA::State*>>::
      _M_realloc_insert<re2::DFA::State*const&>
                ((vector<re2::DFA::State*,std::allocator<re2::DFA::State*>> *)&local_38,
                 (iterator)
                 local_38.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(State **)(p_Var1 + 1));
    }
    else {
      *local_38.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>._M_impl.
       super__Vector_impl_data._M_finish = (State *)p_Var1[1]._M_nxt;
      local_38.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_38.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  std::
  _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(this->state_cache_)._M_h);
  if (local_38.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_38.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 0;
    do {
      if (local_38.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>._M_impl
          .super__Vector_impl_data._M_start[uVar2] != (State *)0x0) {
        operator_delete__(local_38.
                          super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar2]);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)local_38.
                                   super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_38.
                                   super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_38.super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (State **)0x0) {
    operator_delete(local_38.
                    super__Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DFA::ClearCache() {
  // In case state_cache_ doesn't support deleting entries
  // during iteration, copy into a vector and then delete.
  vector<State*> v;
  v.reserve(state_cache_.size());
  for (StateSet::iterator it = state_cache_.begin();
       it != state_cache_.end(); ++it)
    v.push_back(*it);
  state_cache_.clear();
  for (size_t i = 0; i < v.size(); i++)
    delete[] reinterpret_cast<const char*>(v[i]);
}